

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O0

int resolve_union(lyd_node_leaf_list *leaf,lys_type *type,int store,int ignore_fail,
                 lys_type **resolved_type)

{
  uint8_t uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint8_t *puVar5;
  lys_type *plVar6;
  lys_node_leaf *local_98;
  lys_node_leaf *local_88;
  lys_node_leaf *local_78;
  lys_node_leaf *local_60;
  char *json_val;
  int req_inst;
  int ext_dep;
  int success;
  int hidden;
  int found;
  lyd_node *ret;
  lys_type *t;
  lys_type **resolved_type_local;
  int ignore_fail_local;
  int store_local;
  lys_type *type_local;
  lyd_node_leaf_list *leaf_local;
  
  bVar2 = false;
  local_60 = (lys_node_leaf *)0x0;
  t = (lys_type *)resolved_type;
  resolved_type_local._0_4_ = ignore_fail;
  resolved_type_local._4_4_ = store;
  _ignore_fail_local = type;
  type_local = (lys_type *)leaf;
  if (type->base != LY_TYPE_UNION) {
    __assert_fail("type->base == LY_TYPE_UNION",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
                  ,0x1d32,
                  "int resolve_union(struct lyd_node_leaf_list *, struct lys_type *, int, int, struct lys_type **)"
                 );
  }
  if ((leaf->value_type == 0xb) || (leaf->value_type == 0x88)) {
    local_60 = (lys_node_leaf *)(leaf->value).binary;
  }
  if (store != 0) {
    if ((leaf->value_type & 0x3f) == 2) {
      free((leaf->value).binary);
    }
    memset((void *)((long)&type_local->info + 0x10),0,8);
  }
  puVar5 = ly_vlog_hide_location();
  uVar1 = *puVar5;
  ly_vlog_hide('\x01');
  ret = (lyd_node *)0x0;
  success = 0;
  while (ret = (lyd_node *)lyp_get_next_union_type(_ignore_fail_local,(lys_type *)ret,&success),
        (lys_type *)ret != (lys_type *)0x0) {
    success = 0;
    if (((lys_type *)ret)->base == LY_TYPE_INST) {
      if (local_60 == (lys_node_leaf *)0x0) {
        local_78 = (type_local->info).lref.target;
      }
      else {
        local_78 = local_60;
      }
      iVar3 = check_instid_ext_dep((lys_node *)type_local->module_name,(char *)local_78);
      if (((int)resolved_type_local == 1) || ((iVar3 != 0 && ((int)resolved_type_local == 2)))) {
        json_val._4_4_ = -1;
      }
      else {
        json_val._4_4_ = (int)*(char *)&ret->parent;
      }
      if (local_60 == (lys_node_leaf *)0x0) {
        local_88 = (type_local->info).lref.target;
      }
      else {
        local_88 = local_60;
      }
      iVar4 = resolve_instid((lyd_node *)type_local,(char *)local_88,json_val._4_4_,
                             (lyd_node **)&hidden);
      if (iVar4 == 0) {
        if (resolved_type_local._4_4_ != 0) {
          if ((_hidden == (lyd_node *)0x0) || (iVar3 != 0)) {
            if (local_60 == (lys_node_leaf *)0x0) {
              (type_local->info).dec64.div = 0;
            }
            else {
              (type_local->info).dec64.div = (uint64_t)local_60;
              local_60 = (lys_node_leaf *)0x0;
            }
            *(undefined2 *)&type_local[1].module_name = 0x88;
          }
          else {
            (type_local->info).dec64.div = (uint64_t)_hidden;
            *(undefined2 *)&type_local[1].module_name = 8;
            if (local_60 != (lys_node_leaf *)0x0) {
              lydict_remove((ly_ctx *)**(undefined8 **)(type_local->module_name + 0x30),
                            (char *)(type_local->info).lref.target);
              (type_local->info).lref.target = local_60;
              local_60 = (lys_node_leaf *)0x0;
            }
          }
        }
        bVar2 = true;
      }
    }
    else if (((lys_type *)ret)->base == LY_TYPE_LEAFREF) {
      if (((int)resolved_type_local == 1) ||
         (((*(ushort *)(type_local->module_name + 0x18) & 0x400) != 0 &&
          ((int)resolved_type_local == 2)))) {
        json_val._4_4_ = -1;
      }
      else {
        json_val._4_4_ = (int)(((lys_type *)ret)->info).lref.req;
      }
      iVar3 = resolve_leafref((lyd_node_leaf_list *)type_local,(((lys_type *)ret)->info).lref.path,
                              json_val._4_4_,(lyd_node **)&hidden);
      if (iVar3 == 0) {
        if (resolved_type_local._4_4_ != 0) {
          if ((_hidden == (lyd_node *)0x0) ||
             ((*(ushort *)(type_local->module_name + 0x18) & 0x400) != 0)) {
            plVar6 = lyp_parse_value((lys_type *)ret,(char **)&(type_local->info).lref.target,
                                     (lyxml_elem *)0x0,(lyd_node_leaf_list *)type_local,
                                     (lyd_attr *)0x0,1,0);
            if (plVar6 == (lys_type *)0x0) {
              return -1;
            }
          }
          else {
            (type_local->info).dec64.div = (uint64_t)_hidden;
            *(undefined2 *)&type_local[1].module_name = 9;
          }
        }
        bVar2 = true;
      }
    }
    else {
      plVar6 = lyp_parse_value((lys_type *)ret,(char **)&(type_local->info).lref.target,
                               (lyxml_elem *)0x0,(lyd_node_leaf_list *)type_local,(lyd_attr *)0x0,
                               resolved_type_local._4_4_,0);
      if (plVar6 != (lys_type *)0x0) {
        bVar2 = true;
      }
    }
    if (bVar2) break;
    ly_err_clean(1);
    if (resolved_type_local._4_4_ != 0) {
      if (*(int *)&ret->validity == 2) {
        free((void *)(type_local->info).dec64.div);
      }
      memset((void *)((long)&type_local->info + 0x10),0,8);
    }
  }
  if (uVar1 == '\0') {
    ly_vlog_hide('\0');
  }
  if (local_60 != (lys_node_leaf *)0x0) {
    if (bVar2) {
      lydict_remove((ly_ctx *)**(undefined8 **)(type_local->module_name + 0x30),(char *)local_60);
    }
    else {
      if (*(short *)&type_local[1].module_name != 0xb) {
        __assert_fail("leaf->value_type == LY_TYPE_UNION",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
                      ,0x1da6,
                      "int resolve_union(struct lyd_node_leaf_list *, struct lys_type *, int, int, struct lys_type **)"
                     );
      }
      (type_local->info).dec64.div = (uint64_t)local_60;
    }
  }
  if (bVar2) {
    if (t != (lys_type *)0x0) {
      t->module_name = (char *)ret;
    }
  }
  else if (((int)resolved_type_local == 0) || ((_ignore_fail_local->info).uni.has_ptr_type == 0)) {
    if ((type_local->info).lref.target == (lys_node_leaf *)0x0) {
      local_98 = (lys_node_leaf *)0x1c74e7;
    }
    else {
      local_98 = (type_local->info).lref.target;
    }
    ly_vlog(LYE_INVAL,LY_VLOG_LYD,type_local,local_98,*(undefined8 *)type_local->module_name);
    return 1;
  }
  return 0;
}

Assistant:

int
resolve_union(struct lyd_node_leaf_list *leaf, struct lys_type *type, int store, int ignore_fail,
              struct lys_type **resolved_type)
{
    struct lys_type *t;
    struct lyd_node *ret;
    int found, hidden, success = 0, ext_dep, req_inst;
    const char *json_val = NULL;

    assert(type->base == LY_TYPE_UNION);

    if ((leaf->value_type == LY_TYPE_UNION) || (leaf->value_type == (LY_TYPE_INST | LY_TYPE_INST_UNRES))) {
        /* either NULL or instid previously converted to JSON */
        json_val = leaf->value.string;
    }

    if (store) {
        if ((leaf->value_type & LY_DATA_TYPE_MASK) == LY_TYPE_BITS) {
            free(leaf->value.bit);
        }
        memset(&leaf->value, 0, sizeof leaf->value);
    }

    /* turn logging off, we are going to try to validate the value with all the types in order */
    hidden = *ly_vlog_hide_location();
    ly_vlog_hide(1);

    t = NULL;
    found = 0;
    while ((t = lyp_get_next_union_type(type, t, &found))) {
        found = 0;

        switch (t->base) {
        case LY_TYPE_LEAFREF:
            if ((ignore_fail == 1) || ((leaf->schema->flags & LYS_LEAFREF_DEP) && (ignore_fail == 2))) {
                req_inst = -1;
            } else {
                req_inst = t->info.lref.req;
            }

            if (!resolve_leafref(leaf, t->info.lref.path, req_inst, &ret)) {
                if (store) {
                    if (ret && !(leaf->schema->flags & LYS_LEAFREF_DEP)) {
                        /* valid resolved */
                        leaf->value.leafref = ret;
                        leaf->value_type = LY_TYPE_LEAFREF;
                    } else {
                        /* valid unresolved */
                        if (!lyp_parse_value(t, &leaf->value_str, NULL, leaf, NULL, 1, 0)) {
                            return -1;
                        }
                    }
                }

                success = 1;
            }
            break;
        case LY_TYPE_INST:
            ext_dep = check_instid_ext_dep(leaf->schema, (json_val ? json_val : leaf->value_str));
            if ((ignore_fail == 1) || (ext_dep && (ignore_fail == 2))) {
                req_inst = -1;
            } else {
                req_inst = t->info.inst.req;
            }

            if (!resolve_instid((struct lyd_node *)leaf, (json_val ? json_val : leaf->value_str), req_inst, &ret)) {
                if (store) {
                    if (ret && !ext_dep) {
                        /* valid resolved */
                        leaf->value.instance = ret;
                        leaf->value_type = LY_TYPE_INST;

                        if (json_val) {
                            lydict_remove(leaf->schema->module->ctx, leaf->value_str);
                            leaf->value_str = json_val;
                            json_val = NULL;
                        }
                    } else {
                        /* valid unresolved */
                        if (json_val) {
                            /* put the JSON val back */
                            leaf->value.string = json_val;
                            json_val = NULL;
                        } else {
                            leaf->value.instance = NULL;
                        }
                        leaf->value_type = LY_TYPE_INST | LY_TYPE_INST_UNRES;
                    }
                }

                success = 1;
            }
            break;
        default:
            if (lyp_parse_value(t, &leaf->value_str, NULL, leaf, NULL, store, 0)) {
                success = 1;
            }
            break;
        }

        if (success) {
            break;
        }

        /* erase information about errors - they are false or irrelevant
         * and will be replaced by a single error messages */
        ly_err_clean(1);

        /* erase possible present and invalid value data */
        if (store) {
            if (t->base == LY_TYPE_BITS) {
                free(leaf->value.bit);
            }
            memset(&leaf->value, 0, sizeof leaf->value);
        }
    }

    /* turn logging back on */
    if (!hidden) {
        ly_vlog_hide(0);
    }

    if (json_val) {
        if (!success) {
            /* put the value back for now */
            assert(leaf->value_type == LY_TYPE_UNION);
            leaf->value.string = json_val;
        } else {
            /* value was ultimately useless, but we could not have known */
            lydict_remove(leaf->schema->module->ctx, json_val);
        }
    }

    if (success) {
        if (resolved_type) {
            *resolved_type = t;
        }
    } else if (!ignore_fail || !type->info.uni.has_ptr_type) {
        /* not found and it is required */
        LOGVAL(LYE_INVAL, LY_VLOG_LYD, leaf, leaf->value_str ? leaf->value_str : "", leaf->schema->name);
        return EXIT_FAILURE;
    }

    return EXIT_SUCCESS;

}